

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

size_t nni_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  if (in_len == 0) {
    uVar5 = 0;
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar9 = 0;
    do {
      uVar4 = uVar4 << 8 | (uint)in[uVar2];
      uVar5 = uVar9 + 8;
      bVar10 = uVar5 < 6;
      if ((!bVar10) && (uVar5 = uVar9 + 2, uVar3 < out_len)) {
        uVar9 = uVar5 / 6;
        lVar1 = 0;
        uVar7 = uVar3;
        do {
          uVar8 = uVar5;
          lVar6 = lVar1;
          out[uVar7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                       [uVar4 >> ((byte)uVar8 & 0x1f) & 0x3f];
          uVar5 = uVar8;
          if (-uVar9 == (int)lVar6) break;
          uVar7 = uVar7 + 1;
          uVar5 = uVar8 - 6;
          lVar1 = lVar6 + -1;
        } while (uVar7 < out_len);
        bVar10 = uVar8 < 6;
        uVar3 = (uVar3 - lVar6) + 1;
      }
      if (!bVar10) {
        return 0xffffffffffffffff;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
      uVar9 = uVar5;
    } while (uVar2 < in_len);
  }
  if (uVar5 == 0) goto LAB_0013d5fd;
  if (uVar3 < out_len) {
    out[uVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [uVar4 << (6U - (char)uVar5 & 0x1f) & 0x3f];
    while( true ) {
      uVar3 = uVar3 + 1;
LAB_0013d5fd:
      if ((uVar3 & 3) == 0) {
        if (out_len <= uVar3) {
          return 0xffffffffffffffff;
        }
        out[uVar3] = '\0';
        return uVar3;
      }
      if (out_len <= uVar3) break;
      out[uVar3] = '=';
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nni_base64_encode(const uint8_t *in, size_t in_len, char *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	size_t   io;

	const uint8_t encode[65] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
	                           "abcdefghijklmnopqrstuvwxyz"
	                           "0123456789+/";

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		uint8_t ch = in[ii];
		v          = (v << 8u) | ch;
		rem += 8;
		while (rem >= 6) {
			rem -= 6;
			if (io >= out_len)
				return (-1);
			out[io++] = encode[(v >> rem) & 63u];
		}
	}

	if (rem) {
		v <<= (6 - rem);
		if (io >= out_len)
			return (-1);
		out[io++] = encode[v & 63u];
	}

	// Pad to a multiple of 3.
	while (io & 3u) {
		if (io >= out_len)
			return (-1);
		out[io++] = '=';
	}

	if (io >= out_len)
		return (-1);

	out[io] = '\0';

	return (io);
}